

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O0

bool btGjkEpaSolver2::Distance
               (btConvexShape *shape0,btTransform *wtrs0,btConvexShape *shape1,btTransform *wtrs1,
               btVector3 *guess,sResults *results)

{
  undefined4 *in_R9;
  btScalar bVar1;
  btVector3 bVar2;
  btScalar p;
  U i;
  btVector3 w1;
  btVector3 w0;
  _ gjk_status;
  GJK gjk;
  tShape shape;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffc6c;
  undefined4 in_stack_fffffffffffffc70;
  U in_stack_fffffffffffffc74;
  undefined4 in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc7c;
  GJK *in_stack_fffffffffffffc80;
  btVector3 *v1;
  btScalar in_stack_fffffffffffffcf4;
  undefined1 withmargins;
  btScalar in_stack_fffffffffffffcf8;
  btScalar in_stack_fffffffffffffcfc;
  btScalar in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  undefined4 in_stack_fffffffffffffd10;
  btScalar in_stack_fffffffffffffd14;
  btScalar in_stack_fffffffffffffd18;
  btScalar in_stack_fffffffffffffd1c;
  btScalar in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  uint local_2d8;
  btScalar local_2d4;
  btScalar local_2d0;
  btScalar local_2cc;
  btVector3 local_2c8;
  btScalar local_2b8;
  btScalar local_2b4;
  btScalar local_2b0;
  btVector3 local_2ac;
  _ local_29c;
  btVector3 *in_stack_fffffffffffffdc0;
  tShape *in_stack_fffffffffffffdc8;
  GJK *in_stack_fffffffffffffdd0;
  long local_d8;
  bool local_1;
  
  withmargins = (undefined1)((uint)in_stack_fffffffffffffcf4 >> 0x18);
  gjkepa2_impl::MinkowskiDiff::MinkowskiDiff
            ((MinkowskiDiff *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  uVar3 = 0;
  gjkepa2_impl::Initialize
            ((btConvexShape *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
             (btTransform *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
             (btConvexShape *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
             (btTransform *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
             (sResults *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
             (tShape *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
             (bool)withmargins);
  gjkepa2_impl::GJK::GJK(in_stack_fffffffffffffc80);
  local_29c = gjkepa2_impl::GJK::Evaluate
                        (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                         in_stack_fffffffffffffdc0);
  if (local_29c == Valid) {
    local_2b0 = 0.0;
    local_2b4 = 0.0;
    local_2b8 = 0.0;
    btVector3::btVector3(&local_2ac,&local_2b0,&local_2b4,&local_2b8);
    local_2cc = 0.0;
    local_2d0 = 0.0;
    local_2d4 = 0.0;
    btVector3::btVector3(&local_2c8,&local_2cc,&local_2d0,&local_2d4);
    for (local_2d8 = 0; local_2d8 < *(uint *)(local_d8 + 0x30); local_2d8 = local_2d8 + 1) {
      gjkepa2_impl::MinkowskiDiff::Support
                (&in_stack_fffffffffffffc80->m_shape,
                 (btVector3 *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                 in_stack_fffffffffffffc74);
      ::operator*((btVector3 *)in_stack_fffffffffffffc80,
                  (btScalar *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      btVector3::operator+=(&local_2ac,(btVector3 *)&stack0xfffffffffffffd14);
      operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
      gjkepa2_impl::MinkowskiDiff::Support
                (&in_stack_fffffffffffffc80->m_shape,
                 (btVector3 *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                 in_stack_fffffffffffffc74);
      ::operator*((btVector3 *)in_stack_fffffffffffffc80,
                  (btScalar *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      btVector3::operator+=(&local_2c8,(btVector3 *)&stack0xfffffffffffffcf4);
    }
    v1 = &local_2ac;
    bVar2 = btTransform::operator*
                      ((btTransform *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                       (btVector3 *)CONCAT44(in_stack_fffffffffffffc6c,uVar3));
    *(long *)(in_R9 + 1) = bVar2.m_floats._0_8_;
    *(long *)(in_R9 + 3) = bVar2.m_floats._8_8_;
    bVar2 = btTransform::operator*
                      ((btTransform *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                       (btVector3 *)CONCAT44(in_stack_fffffffffffffc6c,uVar3));
    *(long *)(in_R9 + 5) = bVar2.m_floats._0_8_;
    *(long *)(in_R9 + 7) = bVar2.m_floats._8_8_;
    bVar2 = operator-(v1,(btVector3 *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78))
    ;
    *(long *)(in_R9 + 9) = bVar2.m_floats._0_8_;
    *(long *)(in_R9 + 0xb) = bVar2.m_floats._8_8_;
    bVar1 = btVector3::length((btVector3 *)0x1e4ca5);
    in_R9[0xd] = bVar1;
    btVector3::operator/=
              ((btVector3 *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
               (btScalar *)CONCAT44(in_stack_fffffffffffffc6c,uVar3));
    local_1 = true;
  }
  else {
    uVar3 = 2;
    if (local_29c == Inside) {
      uVar3 = 1;
    }
    *in_R9 = uVar3;
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool		btGjkEpaSolver2::Distance(	const btConvexShape*	shape0,
									  const btTransform&		wtrs0,
									  const btConvexShape*	shape1,
									  const btTransform&		wtrs1,
									  const btVector3&		guess,
									  sResults&				results)
{
	tShape			shape;
	Initialize(shape0,wtrs0,shape1,wtrs1,results,shape,false);
	GJK				gjk;
	GJK::eStatus::_	gjk_status=gjk.Evaluate(shape,guess);
	if(gjk_status==GJK::eStatus::Valid)
	{
		btVector3	w0=btVector3(0,0,0);
		btVector3	w1=btVector3(0,0,0);
		for(U i=0;i<gjk.m_simplex->rank;++i)
		{
			const btScalar	p=gjk.m_simplex->p[i];
			w0+=shape.Support( gjk.m_simplex->c[i]->d,0)*p;
			w1+=shape.Support(-gjk.m_simplex->c[i]->d,1)*p;
		}
		results.witnesses[0]	=	wtrs0*w0;
		results.witnesses[1]	=	wtrs0*w1;
		results.normal			=	w0-w1;
		results.distance		=	results.normal.length();
		results.normal			/=	results.distance>GJK_MIN_DISTANCE?results.distance:1;
		return(true);
	}
	else
	{
		results.status	=	gjk_status==GJK::eStatus::Inside?
			sResults::Penetrating	:
		sResults::GJK_Failed	;
		return(false);
	}
}